

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O2

ON_wString __thiscall ON_ModelComponent::NameReferencePrefix(ON_ModelComponent *this,wchar_t *name)

{
  long lVar1;
  int iVar2;
  wchar_t *pwVar3;
  long lVar4;
  
  if ((name == (wchar_t *)0x0) || (*name == L'\0')) {
LAB_005455d8:
    ON_wString::ON_wString((ON_wString *)this,&ON_wString::EmptyString);
  }
  else {
    lVar4 = 0;
    iVar2 = 1;
    while (iVar2 != 0) {
      lVar1 = lVar4 + 4;
      lVar4 = lVar4 + 4;
      iVar2 = *(int *)((long)name + lVar1);
    }
    do {
      if ((wchar_t *)((long)name + lVar4) <= name) goto LAB_005455d8;
      pwVar3 = IsReferencePrefixDelimiter((wchar_t *)((long)name + lVar4 + -4));
      lVar4 = lVar4 + -4;
    } while (pwVar3 == (wchar_t *)0x0);
    ON_wString::ON_wString((ON_wString *)this,name);
    ON_wString::SetLength((ON_wString *)this,lVar4 >> 2);
    pwVar3 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)this);
    RemoveAllReferencePrefixDelimiters((ON_ModelComponent *)&stack0xffffffffffffffd8,pwVar3);
    ON_wString::operator=((ON_wString *)this,(ON_wString *)&stack0xffffffffffffffd8);
    ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffffd8);
    ON_wString::TrimLeftAndRight((ON_wString *)this,(wchar_t *)0x0);
  }
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_ModelComponent::NameReferencePrefix(const wchar_t * name)
{
  if (nullptr == name || 0 == name[0])
    return ON_wString::EmptyString;
  const wchar_t* tail = name;
  while (0 != *tail)
    tail++;

  while (tail > name)
  {
    tail--;
    const wchar_t* s = ON_ModelComponent::IsReferencePrefixDelimiter(tail);
    if (nullptr != s)
    {
      ON_wString name_reference = name;
      name_reference.SetLength(tail - name);
      name_reference = ON_ModelComponent::RemoveAllReferencePrefixDelimiters(name_reference);
      name_reference.TrimLeftAndRight();
      return name_reference;
    }
  }

  return ON_wString::EmptyString;  
}